

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

char * __thiscall
sentencepiece::NBestSentencePieceText::_InternalParse
          (NBestSentencePieceText *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  void *pvVar4;
  bool bVar5;
  SentencePieceText *msg;
  char cVar6;
  uint res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  byte *local_38;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = (byte *)ptr;
  do {
    bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar5) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    pbVar7 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
      if ((char)*pbVar7 < '\0') {
        pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
        pbVar7 = (byte *)pVar8.first;
        res = pVar8.second;
      }
      else {
        pbVar7 = local_38 + 2;
      }
    }
    local_38 = pbVar7;
    if (pbVar7 == (byte *)0x0) {
LAB_001b2145:
      cVar6 = '\x04';
    }
    else if (res == 10) {
      local_38 = pbVar7 + -1;
      do {
        local_38 = local_38 + 1;
        pRVar3 = (this->nbests_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar3 == (Rep *)0x0) {
LAB_001b208d:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&(this->nbests_).super_RepeatedPtrFieldBase,
                     (this->nbests_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_001b209b:
          pRVar3 = (this->nbests_).super_RepeatedPtrFieldBase.rep_;
          pRVar3->allocated_size = pRVar3->allocated_size + 1;
          msg = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::SentencePieceText>
                          ((this->nbests_).super_RepeatedPtrFieldBase.arena_);
          pRVar3 = (this->nbests_).super_RepeatedPtrFieldBase.rep_;
          iVar2 = (this->nbests_).super_RepeatedPtrFieldBase.current_size_;
          (this->nbests_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          pRVar3->elements[iVar2] = msg;
        }
        else {
          iVar2 = (this->nbests_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar3->allocated_size <= iVar2) {
            if (pRVar3->allocated_size == (this->nbests_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_001b208d;
            goto LAB_001b209b;
          }
          (this->nbests_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          msg = (SentencePieceText *)pRVar3->elements[iVar2];
        }
        local_38 = (byte *)google::protobuf::internal::ParseContext::
                           ParseMessage<sentencepiece::SentencePieceText>(ctx,msg,(char *)local_38);
        if (local_38 == (byte *)0x0) goto LAB_001b2145;
        cVar6 = '\x02';
      } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 10));
    }
    else if (res == 0 || (res & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      cVar6 = '\t';
    }
    else {
      pvVar4 = this_00->ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (res,unknown,(char *)local_38,ctx);
      cVar6 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
    if (cVar6 != '\x02') {
      if (cVar6 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* NBestSentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.SentencePieceText nbests = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nbests(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}